

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kph.cpp
# Opt level: O2

void __thiscall
HA_Candlestick::HA_Candlestick(HA_Candlestick *this,Candlestick *curr,HA_Candlestick *prior)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  (this->super_Candlestick).time = curr->time;
  (this->super_Candlestick).volume = curr->volume;
  dVar1 = (curr->open + curr->close + curr->low + curr->high) * 0.25;
  (this->super_Candlestick).close = dVar1;
  dVar2 = ((prior->super_Candlestick).open + (prior->super_Candlestick).close) * 0.5;
  (this->super_Candlestick).open = dVar2;
  dVar3 = dVar1;
  if (dVar2 <= dVar1) {
    dVar3 = dVar2;
  }
  if (curr->low <= dVar3) {
    dVar3 = curr->low;
  }
  (this->super_Candlestick).low = dVar3;
  if (dVar1 <= dVar2) {
    dVar1 = dVar2;
  }
  if (dVar1 <= curr->high) {
    dVar1 = curr->high;
  }
  (this->super_Candlestick).high = dVar1;
  return;
}

Assistant:

HA_Candlestick(const Candlestick& curr, const HA_Candlestick& prior) 
   {
      time = curr.time;
      volume = curr.volume;
      close =  (curr.open + curr.close + curr.low + curr.high) / 4;
      open = (prior.open + prior.close) / 2;
      low = min(curr.low, min(open, close)); 
      high = max(curr.high, max(open, close));
   }